

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppEmitter.cpp
# Opt level: O0

void __thiscall
calc4::anon_unknown_0::Visitor<__int128>::Visit
          (Visitor<__int128> *this,shared_ptr<const_calc4::BinaryOperator> *op)

{
  BinaryType BVar1;
  element_type *peVar2;
  char *operatorChar;
  int right;
  int left;
  shared_ptr<const_calc4::Operator> *in_stack_ffffffffffffffa8;
  Visitor<__int128> *in_stack_ffffffffffffffb0;
  
  peVar2 = std::
           __shared_ptr_access<const_calc4::BinaryOperator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_calc4::BinaryOperator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x138802);
  BinaryOperator::GetLeft(peVar2);
  ProcessOperator(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  peVar2 = std::
           __shared_ptr_access<const_calc4::BinaryOperator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_calc4::BinaryOperator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x138825);
  BinaryOperator::GetRight(peVar2);
  ProcessOperator(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  peVar2 = std::
           __shared_ptr_access<const_calc4::BinaryOperator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_calc4::BinaryOperator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x138848);
  BVar1 = BinaryOperator::GetType(peVar2);
  (*(code *)(&DAT_0018bc94 + *(int *)(&DAT_0018bc94 + (ulong)BVar1 * 4)))();
  return;
}

Assistant:

virtual void Visit(const std::shared_ptr<const BinaryOperator>& op) override
    {
        int left = ProcessOperator(op->GetLeft());
        int right = ProcessOperator(op->GetRight());

        const char* operatorChar;
        switch (op->GetType())
        {
        case BinaryType::Add:
            operatorChar = "+";
            break;
        case BinaryType::Sub:
            operatorChar = "-";
            break;
        case BinaryType::Mult:
            operatorChar = "*";
            break;
        case BinaryType::Div:
            operatorChar = "/";
            break;
        case BinaryType::Mod:
            operatorChar = "%";
            break;
        case BinaryType::Equal:
            operatorChar = "==";
            break;
        case BinaryType::NotEqual:
            operatorChar = "!=";
            break;
        case BinaryType::LessThan:
            operatorChar = "<";
            break;
        case BinaryType::LessThanOrEqual:
            operatorChar = "<=";
            break;
        case BinaryType::GreaterThanOrEqual:
            operatorChar = ">=";
            break;
        case BinaryType::GreaterThan:
            operatorChar = ">";
            break;
        default:
            UNREACHABLE();
            break;
        }

        AppendVariableDeclarationBegin();
        os << VariableName(left) << ' ' << operatorChar << ' ' << VariableName(right);
        switch (op->GetType())
        {
        case BinaryType::Equal:
        case BinaryType::NotEqual:
        case BinaryType::LessThan:
        case BinaryType::LessThanOrEqual:
        case BinaryType::GreaterThanOrEqual:
        case BinaryType::GreaterThan:
            os << " ? 1 : 0";
            break;
        default:
            break;
        }
        AppendVariableDeclarationEnd();
        Return();
    }